

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O1

double __thiscall
HACD::ICHUll::ComputeDistance
          (ICHUll *this,long name,Vec3<double> *pt,Vec3<double> *normal,bool *insideHull,
          bool updateIncidentPoints)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  CircularListElement<HACD::TMMTriangle> *pCVar3;
  CircularListElement<HACD::TMMVertex> *pCVar4;
  CircularListElement<HACD::TMMVertex> *pCVar5;
  double dVar6;
  double dVar7;
  CircularListElement<HACD::TMMVertex> *pCVar8;
  double dVar9;
  long lVar10;
  mapped_type *pmVar11;
  size_t sVar12;
  CircularListElement<HACD::TMMTriangle> *pCVar13;
  Real RVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dist;
  Vec3<double> ptNormal;
  Vec3<double> ver2;
  Vec3<double> ver1;
  Vec3<double> ver0;
  Vec3<double> p0;
  double local_b8;
  double local_b0;
  Vec3<double> local_a8;
  Vec3<double> local_90;
  Vec3<double> local_78;
  Vec3<double> local_60;
  Vec3<double> local_48;
  
  RVar14 = 0.0;
  if (this->m_isFlat == false) {
    local_48.m_data[0] = pt->m_data[0];
    local_48.m_data[1] = pt->m_data[1];
    local_48.m_data[2] = pt->m_data[2];
    local_a8.m_data[0] = normal->m_data[0];
    local_a8.m_data[1] = normal->m_data[1];
    local_a8.m_data[2] = normal->m_data[2];
    sVar12 = (this->m_mesh).m_triangles.m_size;
    *insideHull = false;
    local_b0 = (double)name;
    if (sVar12 == 0) {
      RVar14 = 0.0;
      pCVar13 = (CircularListElement<HACD::TMMTriangle> *)0x0;
    }
    else {
      pCVar13 = (CircularListElement<HACD::TMMTriangle> *)0x0;
      auVar19 = ZEXT864(0) << 0x40;
      do {
        pCVar3 = (this->m_mesh).m_triangles.m_head;
        pCVar4 = (pCVar3->m_data).m_vertices[0];
        pCVar5 = (pCVar3->m_data).m_vertices[1];
        dVar6 = (double)(pCVar4->m_data).m_name;
        dVar7 = (double)(pCVar5->m_data).m_name;
        if (dVar6 != dVar7) {
          pCVar8 = (pCVar3->m_data).m_vertices[2];
          dVar9 = (double)(pCVar8->m_data).m_name;
          if ((dVar7 != dVar9) && (dVar9 != dVar6)) {
            if ((dVar9 == local_b0) || ((dVar6 == local_b0 || (dVar7 == local_b0)))) {
              local_b8 = 0.0;
LAB_0086ab6c:
              if ((*insideHull != true) || (auVar19._0_8_ < local_b8)) {
                *insideHull = true;
                pCVar13 = (this->m_mesh).m_triangles.m_head;
                auVar19 = ZEXT864((ulong)local_b8);
              }
            }
            else {
              local_60.m_data[0] = (pCVar4->m_data).m_pos.m_data[0];
              local_60.m_data[1] = (pCVar4->m_data).m_pos.m_data[1];
              local_60.m_data[2] = (pCVar4->m_data).m_pos.m_data[2];
              local_78.m_data[0] = (pCVar5->m_data).m_pos.m_data[0];
              local_78.m_data[1] = (pCVar5->m_data).m_pos.m_data[1];
              local_78.m_data[2] = (pCVar5->m_data).m_pos.m_data[2];
              local_90.m_data[0] = (pCVar8->m_data).m_pos.m_data[0];
              local_90.m_data[1] = (pCVar8->m_data).m_pos.m_data[1];
              local_90.m_data[2] = (pCVar8->m_data).m_pos.m_data[2];
              auVar22._8_8_ = 0;
              auVar22._0_8_ = local_90.m_data[2] - local_60.m_data[2];
              auVar25._8_8_ = 0;
              auVar25._0_8_ = local_78.m_data[1] - local_60.m_data[1];
              auVar28._8_8_ = 0;
              auVar28._0_8_ =
                   (local_90.m_data[1] - local_60.m_data[1]) *
                   (local_78.m_data[2] - local_60.m_data[2]);
              auVar22 = vfmsub231sd_fma(auVar28,auVar25,auVar22);
              auVar15._8_8_ = 0;
              auVar15._0_8_ = local_90.m_data[0] - local_60.m_data[0];
              auVar23._8_8_ = 0;
              auVar23._0_8_ =
                   (local_90.m_data[2] - local_60.m_data[2]) *
                   (local_78.m_data[0] - local_60.m_data[0]);
              auVar27._8_8_ = 0;
              auVar27._0_8_ = local_78.m_data[2] - local_60.m_data[2];
              auVar15 = vfmsub231sd_fma(auVar23,auVar15,auVar27);
              auVar20._8_8_ = 0;
              auVar20._0_8_ = local_90.m_data[1] - local_60.m_data[1];
              auVar24._8_8_ = 0;
              auVar24._0_8_ = local_78.m_data[0] - local_60.m_data[0];
              auVar26._8_8_ = 0;
              auVar26._0_8_ =
                   (local_90.m_data[0] - local_60.m_data[0]) *
                   (local_78.m_data[1] - local_60.m_data[1]);
              auVar20 = vfmsub231sd_fma(auVar26,auVar24,auVar20);
              auVar16._8_8_ = 0;
              auVar16._0_8_ = auVar15._0_8_ * auVar15._0_8_;
              auVar22 = vfmadd231sd_fma(auVar16,auVar22,auVar22);
              auVar22 = vfmadd231sd_fma(auVar22,auVar20,auVar20);
              if (auVar22._0_8_ < 0.0) {
                sqrt(auVar22._0_8_);
              }
              auVar17._8_8_ = 0;
              auVar17._0_8_ = local_a8.m_data[0];
              auVar1._8_8_ = 0;
              auVar1._0_8_ = normal->m_data[0];
              auVar21._8_8_ = 0;
              auVar21._0_8_ = local_a8.m_data[1] * normal->m_data[1];
              auVar22 = vfmadd231sd_fma(auVar21,auVar17,auVar1);
              auVar18._8_8_ = 0;
              auVar18._0_8_ = local_a8.m_data[2];
              auVar2._8_8_ = 0;
              auVar2._0_8_ = normal->m_data[2];
              auVar22 = vfmadd132sd_fma(auVar18,auVar22,auVar2);
              if (auVar22._0_8_ <= 0.0) {
                auVar19 = ZEXT864(auVar19._0_8_);
              }
              else {
                lVar10 = IntersectRayTriangle
                                   (&local_48,&local_a8,&local_60,&local_78,&local_90,&local_b8);
                auVar19 = ZEXT864(auVar19._0_8_);
                if (lVar10 == 1) goto LAB_0086ab6c;
              }
            }
          }
        }
        RVar14 = auVar19._0_8_;
        if ((this->m_mesh).m_triangles.m_size != 0) {
          (this->m_mesh).m_triangles.m_head = ((this->m_mesh).m_triangles.m_head)->m_next;
        }
        sVar12 = sVar12 - 1;
      } while (sVar12 != 0);
    }
    if ((updateIncidentPoints && pCVar13 != (CircularListElement<HACD::TMMTriangle> *)0x0) &&
       (this->m_distPoints !=
        (map<long,_HACD::DPoint,_std::less<long>,_std::allocator<std::pair<const_long,_HACD::DPoint>_>_>
         *)0x0)) {
      pmVar11 = std::
                map<long,_HACD::DPoint,_std::less<long>,_std::allocator<std::pair<const_long,_HACD::DPoint>_>_>
                ::operator[](this->m_distPoints,(key_type_conflict2 *)&local_b0);
      pmVar11->m_dist = RVar14;
      SArray<long,_16UL>::Insert(&(pCVar13->m_data).m_incidentPoints,(long *)&local_b0);
    }
  }
  return RVar14;
}

Assistant:

double ICHUll::ComputeDistance(long name, const Vec3<Real> & pt, const Vec3<Real> & normal, bool & insideHull, bool updateIncidentPoints)
	{
		if (m_isFlat)
		{
			return  0.0;
		}
		else
		{
			Vec3<double> p0( static_cast<double>(pt.X()), 
							 static_cast<double>(pt.Y()), 
							 static_cast<double>(pt.Z()));

			Vec3<double> ptNormal(static_cast<double>(normal.X()), 
								  static_cast<double>(normal.Y()), 
								  static_cast<double>(normal.Z()));
			Vec3<double> impact;
			long nhit;
			double dist;
			double distance = 0.0; 
			size_t nT = m_mesh.GetNTriangles();
			insideHull = false;
			CircularListElement<TMMTriangle> * face = 0;
			Vec3<double> ver0, ver1, ver2;
			for(size_t f = 0; f < nT; f++)
			{
				TMMTriangle & currentTriangle = m_mesh.m_triangles.GetHead()->GetData();
                nhit = 0;
				if (currentTriangle.m_vertices[0]->GetData().m_name != currentTriangle.m_vertices[1]->GetData().m_name &&
					currentTriangle.m_vertices[1]->GetData().m_name != currentTriangle.m_vertices[2]->GetData().m_name &&
					currentTriangle.m_vertices[2]->GetData().m_name != currentTriangle.m_vertices[0]->GetData().m_name)
				{
					if (currentTriangle.m_vertices[0]->GetData().m_name == name ||
						currentTriangle.m_vertices[1]->GetData().m_name == name ||
						currentTriangle.m_vertices[2]->GetData().m_name == name)
					{
						nhit = 1;
						dist = 0.0;
					}
					else
					{
						ver0.X() = currentTriangle.m_vertices[0]->GetData().m_pos.X();
						ver0.Y() = currentTriangle.m_vertices[0]->GetData().m_pos.Y();
						ver0.Z() = currentTriangle.m_vertices[0]->GetData().m_pos.Z();
						ver1.X() = currentTriangle.m_vertices[1]->GetData().m_pos.X();
						ver1.Y() = currentTriangle.m_vertices[1]->GetData().m_pos.Y();
						ver1.Z() = currentTriangle.m_vertices[1]->GetData().m_pos.Z();
						ver2.X() = currentTriangle.m_vertices[2]->GetData().m_pos.X();
						ver2.Y() = currentTriangle.m_vertices[2]->GetData().m_pos.Y();
						ver2.Z() = currentTriangle.m_vertices[2]->GetData().m_pos.Z();
						Vec3<Real> faceNormal = (ver1-ver0) ^ (ver2-ver0);
						faceNormal.Normalize();
						if (ptNormal*normal > 0.0)
						{
							nhit = IntersectRayTriangle(p0, ptNormal, ver0, ver1, ver2, dist);
						}                        
					}
#ifdef HACD_DEBUG
					std::cout << "T " << currentTriangle.m_vertices[0]->GetData().m_name << " "
									  << currentTriangle.m_vertices[1]->GetData().m_name << " "
									  << currentTriangle.m_vertices[2]->GetData().m_name << " "
									  << nhit << " " << dist << std::endl;
#endif
					if (nhit == 1 && (!insideHull || dist > distance) )
					{
						distance = dist;
						insideHull = true;
						face = m_mesh.m_triangles.GetHead();
					}
				}
				m_mesh.m_triangles.Next();
			}
			if (updateIncidentPoints && face && m_distPoints)
			{
				(*m_distPoints)[name].m_dist = static_cast<Real>(distance);
				face->GetData().m_incidentPoints.Insert(name);
			}
			return distance;
		}
	}